

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctrsv.c
# Opt level: O3

void ctrsv_(char *uplo,char *trans,char *diag,integer *n,singlecomplex *a,integer *lda,
           singlecomplex *x,integer *incx)

{
  undefined8 uVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  singlecomplex *psVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  singlecomplex *psVar19;
  ulong uVar20;
  float *pfVar21;
  float *pfVar22;
  int iVar23;
  float *pfVar24;
  float fVar25;
  ulong in_XMM0_Qa;
  float fVar26;
  float fVar27;
  float fVar28;
  singlecomplex sVar29;
  singlecomplex sVar30;
  singlecomplex sVar31;
  singlecomplex sVar32;
  integer info;
  singlecomplex q__3;
  singlecomplex local_b0;
  singlecomplex local_a8;
  singlecomplex local_a0;
  float *local_98;
  int local_8c;
  singlecomplex *local_88;
  int *local_80;
  uint local_74;
  singlecomplex local_70;
  singlecomplex *local_68;
  uint *local_60;
  int local_54;
  float *local_50;
  float *local_48;
  float *local_40;
  singlecomplex *local_38;
  
  local_8c = 0;
  cVar2 = *uplo;
  if ((cVar2 == 'L') || (cVar2 == 'U')) {
    bVar3 = *trans;
    psVar15 = (singlecomplex *)(ulong)bVar3;
    if ((bVar3 - 0x43 < 0x12) && ((0x20801U >> (bVar3 - 0x43 & 0x1f) & 1) != 0)) {
      bVar4 = *diag;
      uVar16 = (uint)bVar4;
      if ((bVar4 == 0x4e) || (bVar4 == 0x55)) {
        uVar5 = *n;
        uVar10 = (ulong)uVar5;
        if ((int)uVar5 < 0) {
          local_8c = 4;
        }
        else if (*lda < (int)(uVar5 + (uVar5 == 0))) {
          local_8c = 6;
        }
        else {
          iVar23 = *incx;
          if (iVar23 != 0) {
            if (uVar5 == 0) {
              return;
            }
            iVar18 = uVar5 - 1;
            local_98 = (float *)CONCAT44(local_98._4_4_,iVar18);
            iVar11 = iVar23 * iVar18;
            local_54 = 1 - iVar11;
            if (0 < iVar23) {
              local_54 = 1;
            }
            local_74 = (uint)bVar4;
            local_88 = a;
            local_80 = lda;
            local_60 = (uint *)n;
            if (bVar3 == 0x4e) {
              if (cVar2 != 'U') {
                if (iVar23 == 1) {
                  lVar17 = 0;
                  uVar9 = 1;
                  do {
                    psVar15 = x + (uVar9 - 1);
                    fVar28 = psVar15->r;
                    sVar30.i = 0.0;
                    sVar30.r = fVar28;
                    if (((fVar28 != 0.0) || (NAN(fVar28))) ||
                       ((x[uVar9 - 1].i != 0.0 || (NAN(x[uVar9 - 1].i))))) {
                      if (bVar4 == 0x4e) {
                        c_div(&local_b0,psVar15,a + ((int)uVar9 + -1) * (*lda + 1));
                        *psVar15 = local_b0;
                        uVar10 = (ulong)*local_60;
                        in_XMM0_Qa = (ulong)local_a0 & 0xffffffff;
                        fVar28 = local_b0.i;
                        a = local_88;
                        lda = local_80;
                        sVar30 = local_b0;
                      }
                      else {
                        fVar28 = x[uVar9 - 1].i;
                      }
                      lVar8 = (long)(int)uVar10;
                      if ((long)uVar9 < lVar8) {
                        iVar23 = *lda;
                        uVar20 = uVar9;
                        do {
                          uVar1 = *(undefined8 *)((long)&a[uVar20].r + iVar23 * lVar17);
                          fVar27 = (float)uVar1;
                          fVar26 = (float)((ulong)uVar1 >> 0x20);
                          fVar25 = fVar27 * sVar30.r + fVar26 * -fVar28;
                          fVar27 = fVar26 * sVar30.r + fVar27 * fVar28;
                          in_XMM0_Qa = CONCAT44(fVar27,fVar25);
                          local_b0.r = x[uVar20].r - fVar25;
                          local_b0.i = x[uVar20].i - fVar27;
                          x[uVar20] = local_b0;
                          uVar20 = uVar20 + 1;
                        } while (uVar10 != uVar20);
                      }
                      local_a0.r = (float)in_XMM0_Qa;
                    }
                    else {
                      lVar8 = (long)(int)uVar10;
                    }
                    lVar17 = lVar17 + 8;
                    bVar7 = (long)uVar9 < lVar8;
                    uVar9 = uVar9 + 1;
                  } while (bVar7);
                  return;
                }
                local_68 = x + -1;
                uVar9 = 1;
                iVar11 = 0;
                iVar18 = local_54;
                do {
                  fVar28 = x[(long)iVar18 + -1].r;
                  sVar32.i = 0.0;
                  sVar32.r = fVar28;
                  iVar13 = (int)uVar9;
                  if ((((fVar28 != 0.0) || (NAN(fVar28))) || (x[(long)iVar18 + -1].i != 0.0)) ||
                     (NAN(x[(long)iVar18 + -1].i))) {
                    if ((char)local_74 == 'N') {
                      c_div(&local_b0,x + (long)iVar18 + -1,a + (*lda + 1) * (iVar13 + -1));
                      x[(long)iVar18 + -1] = local_b0;
                      uVar10 = (ulong)*local_60;
                      in_XMM0_Qa = (ulong)local_a0 & 0xffffffff;
                      iVar23 = *incx;
                      fVar28 = local_b0.i;
                      a = local_88;
                      lda = local_80;
                      sVar32 = local_b0;
                    }
                    else {
                      fVar28 = x[(long)iVar18 + -1].i;
                    }
                    if (iVar13 < (int)uVar10) {
                      iVar6 = *lda;
                      psVar15 = local_68 + (long)iVar18 + (long)iVar23;
                      uVar20 = uVar9;
                      do {
                        lVar17 = (long)iVar11 * (long)iVar6 + uVar20;
                        uVar20 = uVar20 + 1;
                        fVar27 = a[lVar17].r;
                        fVar26 = a[lVar17].i;
                        fVar25 = fVar26 * -fVar28 + sVar32.r * fVar27;
                        fVar27 = fVar27 * fVar28 + sVar32.r * fVar26;
                        in_XMM0_Qa = CONCAT44(fVar27,fVar25);
                        local_b0.r = (*psVar15).r - fVar25;
                        local_b0.i = (*psVar15).i - fVar27;
                        *psVar15 = local_b0;
                        psVar15 = psVar15 + iVar23;
                      } while (uVar10 != uVar20);
                    }
                    local_a0.r = (float)in_XMM0_Qa;
                  }
                  iVar18 = iVar18 + iVar23;
                  uVar9 = uVar9 + 1;
                  iVar11 = iVar11 + 1;
                } while (iVar13 < (int)uVar10);
                return;
              }
              if (iVar23 == 1) {
                lVar17 = uVar10 * 8;
                do {
                  lVar17 = lVar17 + -8;
                  psVar15 = x + (uVar10 - 1);
                  fVar28 = psVar15->r;
                  sVar29.i = 0.0;
                  sVar29.r = fVar28;
                  if ((((fVar28 != 0.0) || (NAN(fVar28))) || (x[uVar10 - 1].i != 0.0)) ||
                     (NAN(x[uVar10 - 1].i))) {
                    if (bVar4 == 0x4e) {
                      c_div(&local_b0,psVar15,a + (int)(uVar10 - 1) * (*lda + 1));
                      *psVar15 = local_b0;
                      in_XMM0_Qa = (ulong)local_a0 & 0xffffffff;
                      fVar28 = local_b0.i;
                      a = local_88;
                      lda = local_80;
                      sVar29 = local_b0;
                    }
                    else {
                      fVar28 = x[uVar10 - 1].i;
                    }
                    if (1 < uVar10) {
                      iVar23 = *lda;
                      uVar9 = uVar10;
                      do {
                        uVar1 = *(undefined8 *)((long)&a[uVar9 - 2].r + iVar23 * lVar17);
                        fVar27 = (float)uVar1;
                        fVar26 = (float)((ulong)uVar1 >> 0x20);
                        fVar25 = fVar27 * sVar29.r + fVar26 * -fVar28;
                        fVar27 = fVar26 * sVar29.r + fVar27 * fVar28;
                        in_XMM0_Qa = CONCAT44(fVar27,fVar25);
                        local_b0.r = x[uVar9 - 2].r - fVar25;
                        local_b0.i = x[uVar9 - 2].i - fVar27;
                        x[uVar9 - 2] = local_b0;
                        uVar9 = uVar9 - 1;
                      } while (1 < (long)uVar9);
                    }
                    local_a0.r = (float)in_XMM0_Qa;
                  }
                  bVar7 = 1 < (long)uVar10;
                  uVar10 = uVar10 - 1;
                } while (bVar7);
                return;
              }
              iVar11 = local_54 + iVar11;
              do {
                fVar28 = x[(long)iVar11 + -1].r;
                sVar31.i = 0.0;
                sVar31.r = fVar28;
                iVar13 = (int)uVar10;
                if (((fVar28 != 0.0) || (NAN(fVar28))) ||
                   ((x[(long)iVar11 + -1].i != 0.0 || (NAN(x[(long)iVar11 + -1].i))))) {
                  if (bVar4 == 0x4e) {
                    c_div(&local_b0,x + (long)iVar11 + -1,a + (*lda + 1) * (iVar13 + -1));
                    x[(long)iVar11 + -1] = local_b0;
                    in_XMM0_Qa = (ulong)local_a0 & 0xffffffff;
                    iVar23 = *incx;
                    fVar28 = local_b0.i;
                    a = local_88;
                    lda = local_80;
                    sVar31 = local_b0;
                  }
                  else {
                    fVar28 = x[(long)iVar11 + -1].i;
                  }
                  if (1 < iVar13) {
                    iVar6 = *lda;
                    iVar12 = iVar11 - iVar23;
                    uVar9 = uVar10;
                    do {
                      fVar27 = a[(long)iVar18 * (long)iVar6 + (uVar9 - 2)].r;
                      fVar26 = a[(long)iVar18 * (long)iVar6 + (uVar9 - 2)].i;
                      fVar25 = fVar27 * sVar31.r + fVar26 * -fVar28;
                      fVar27 = fVar26 * sVar31.r + fVar27 * fVar28;
                      in_XMM0_Qa = CONCAT44(fVar27,fVar25);
                      local_b0.r = x[(long)iVar12 + -1].r - fVar25;
                      local_b0.i = x[(long)iVar12 + -1].i - fVar27;
                      x[(long)iVar12 + -1] = local_b0;
                      uVar9 = uVar9 - 1;
                      iVar12 = iVar12 - iVar23;
                    } while (1 < (long)uVar9);
                  }
                  local_a0.r = (float)in_XMM0_Qa;
                }
                uVar10 = uVar10 - 1;
                iVar11 = iVar11 - iVar23;
                iVar18 = iVar18 + -1;
              } while (1 < iVar13);
              return;
            }
            local_68 = psVar15;
            if (cVar2 != 'U') {
              if (iVar23 != 1) {
                iVar11 = local_54 + iVar11;
                local_48 = &a[-1].i;
                pfVar21 = (float *)(uVar10 * 8);
                local_54 = iVar11;
                do {
                  pfVar21 = (float *)((long)pfVar21 + -8);
                  local_a8 = x[(long)iVar11 + -1];
                  lVar17 = (long)*n;
                  if ((char)psVar15 == 'T') {
                    if ((long)uVar10 < lVar17) {
                      iVar13 = local_54;
                      do {
                        fVar28 = *(float *)((long)local_48 +
                                           lVar17 * 8 + (long)*lda * (long)pfVar21 + -4);
                        fVar27 = *(float *)((long)local_48 + lVar17 * 8 + (long)*lda * (long)pfVar21
                                           );
                        lVar17 = lVar17 + -1;
                        fVar25 = x[(long)iVar13 + -1].r;
                        fVar26 = x[(long)iVar13 + -1].i;
                        local_a0.r = fVar28 * fVar25 + fVar26 * -fVar27;
                        local_a0.i = fVar28 * fVar26 + fVar25 * fVar27;
                        fVar28 = local_a8.i;
                        local_a8.r = local_a8.r - local_a0.r;
                        local_a8.i = fVar28 - local_a0.i;
                        iVar13 = iVar13 - iVar23;
                        local_b0 = local_a8;
                      } while ((long)uVar10 < lVar17);
                    }
                    if ((char)uVar16 == 'N') {
                      psVar15 = a + ((int)uVar10 + -1) * (*lda + 1);
LAB_00110199:
                      c_div(&local_b0,&local_a8,psVar15);
                      n = (integer *)local_60;
                      a = local_88;
                      lda = local_80;
                      psVar15 = local_68;
                      local_a8 = local_b0;
                    }
                  }
                  else {
                    local_98 = (float *)CONCAT44(local_98._4_4_,iVar18);
                    local_50 = pfVar21;
                    if ((long)uVar10 < lVar17) {
                      lVar17 = (long)(*n + -1);
                      iVar23 = local_54;
                      do {
                        r_cnjg(&local_70,a + (long)*lda * (long)iVar18 + lVar17);
                        fVar28 = x[(long)iVar23 + -1].r;
                        fVar27 = x[(long)iVar23 + -1].i;
                        local_a0.r = local_70.r * fVar28 + -local_70.i * fVar27;
                        local_a0.i = local_70.r * fVar27 + local_70.i * fVar28;
                        fVar28 = local_a8.i;
                        local_a8.r = local_a8.r - local_a0.r;
                        local_a8.i = fVar28 - local_a0.i;
                        iVar23 = iVar23 - *incx;
                        bVar7 = (long)uVar10 < lVar17;
                        lVar17 = lVar17 + -1;
                        a = local_88;
                        lda = local_80;
                        local_b0 = local_a8;
                      } while (bVar7);
                    }
                    pfVar21 = local_50;
                    uVar16 = local_74;
                    iVar18 = (int)local_98;
                    n = (integer *)local_60;
                    psVar15 = local_68;
                    if ((char)local_74 == 'N') {
                      r_cnjg(&local_a0,a + ((int)uVar10 + -1) * (*lda + 1));
                      psVar15 = &local_a0;
                      goto LAB_00110199;
                    }
                  }
                  x[(long)iVar11 + -1] = local_a8;
                  iVar23 = *incx;
                  iVar11 = iVar11 - iVar23;
                  iVar18 = iVar18 + -1;
                  bVar7 = (long)uVar10 < 2;
                  uVar10 = uVar10 - 1;
                  if (bVar7) {
                    return;
                  }
                } while( true );
              }
              local_50 = &a[-1].i;
              lVar17 = uVar10 * 8;
              do {
                lVar17 = lVar17 + -8;
                uVar9 = uVar10 - 1;
                local_a8 = x[uVar10 - 1];
                lVar8 = (long)*n;
                if ((char)psVar15 == 'T') {
                  if ((long)uVar10 < lVar8) {
                    do {
                      fVar28 = *(float *)((long)local_50 + lVar8 * 8 + *lda * lVar17 + -4);
                      fVar27 = *(float *)((long)local_50 + lVar8 * 8 + *lda * lVar17);
                      lVar14 = lVar8 + -1;
                      lVar8 = lVar8 + -1;
                      fVar25 = x[lVar14].r;
                      fVar26 = x[lVar14].i;
                      local_a0.r = fVar28 * fVar25 + fVar26 * -fVar27;
                      local_a0.i = fVar28 * fVar26 + fVar25 * fVar27;
                      fVar28 = local_a8.i;
                      local_a8.r = local_a8.r - local_a0.r;
                      local_a8.i = fVar28 - local_a0.i;
                      local_b0 = local_a8;
                    } while ((long)uVar10 < lVar8);
                  }
                  if ((char)uVar16 == 'N') {
                    psVar15 = a + (int)uVar9 * (*lda + 1);
LAB_0010face:
                    c_div(&local_b0,&local_a8,psVar15);
                    n = (integer *)local_60;
                    a = local_88;
                    lda = local_80;
                    psVar15 = local_68;
                    local_a8 = local_b0;
                  }
                }
                else {
                  local_98 = (float *)CONCAT44(local_98._4_4_,iVar18);
                  if ((long)uVar10 < lVar8) {
                    uVar20 = (long)(*n + -1);
                    do {
                      r_cnjg(&local_70,a + (long)*lda * (long)iVar18 + uVar20);
                      fVar28 = x[uVar20 & 0xffffffff].r;
                      fVar27 = x[uVar20 & 0xffffffff].i;
                      local_a0.r = local_70.r * fVar28 + -local_70.i * fVar27;
                      local_a0.i = local_70.r * fVar27 + local_70.i * fVar28;
                      fVar28 = local_a8.i;
                      local_a8.r = local_a8.r - local_a0.r;
                      local_a8.i = fVar28 - local_a0.i;
                      bVar7 = (long)uVar10 < (long)uVar20;
                      a = local_88;
                      lda = local_80;
                      uVar20 = uVar20 - 1;
                      local_b0 = local_a8;
                    } while (bVar7);
                  }
                  uVar16 = local_74;
                  iVar18 = (int)local_98;
                  n = (integer *)local_60;
                  psVar15 = local_68;
                  if ((char)local_74 == 'N') {
                    r_cnjg(&local_a0,a + (int)uVar9 * (*lda + 1));
                    psVar15 = &local_a0;
                    goto LAB_0010face;
                  }
                }
                x[uVar9] = local_a8;
                iVar18 = iVar18 + -1;
                bVar7 = (long)uVar10 < 2;
                uVar10 = uVar9;
                if (bVar7) {
                  return;
                }
              } while( true );
            }
            if (iVar23 != 1) {
              local_38 = x + (long)local_54 + -1;
              local_40 = &a->i;
              pfVar21 = (float *)0x1;
              pfVar24 = (float *)0x0;
              lVar17 = 0;
              iVar18 = local_54;
              do {
                lVar8 = (long)pfVar21 - 1;
                local_a8 = x[(long)iVar18 + -1];
                if ((char)psVar15 == 'T') {
                  if (1 < pfVar21) {
                    lVar14 = 0;
                    psVar19 = local_38;
                    do {
                      fVar28 = *(float *)((long)local_40 +
                                         lVar14 * 8 + (long)*lda * (long)pfVar24 + -4);
                      fVar27 = *(float *)((long)local_40 + lVar14 * 8 + (long)*lda * (long)pfVar24);
                      fVar25 = (*psVar19).r;
                      fVar26 = (*psVar19).i;
                      local_a0.r = fVar28 * fVar25 + fVar26 * -fVar27;
                      local_a0.i = fVar28 * fVar26 + fVar25 * fVar27;
                      fVar28 = local_a8.i;
                      local_a8.r = local_a8.r - local_a0.r;
                      local_a8.i = fVar28 - local_a0.i;
                      psVar19 = psVar19 + iVar23;
                      lVar14 = lVar14 + 1;
                      local_b0 = local_a8;
                      local_98 = (float *)lVar8;
                    } while (lVar17 != lVar14);
                  }
                  pfVar22 = pfVar21;
                  if ((char)uVar16 == 'N') {
                    psVar15 = a + (int)lVar8 * (*lda + 1);
LAB_0010fe1d:
                    c_div(&local_b0,&local_a8,psVar15);
                    n = (integer *)local_60;
                    a = local_88;
                    lda = local_80;
                    psVar15 = local_68;
                    pfVar22 = pfVar21;
                    local_a8 = local_b0;
                  }
                }
                else {
                  local_98 = (float *)lVar8;
                  local_50 = pfVar24;
                  local_48 = pfVar21;
                  if (1 < pfVar21) {
                    lVar14 = 0;
                    iVar23 = local_54;
                    do {
                      r_cnjg(&local_70,a + (long)*lda * (long)(int)lVar17 + lVar14);
                      fVar28 = x[(long)iVar23 + -1].r;
                      fVar27 = x[(long)iVar23 + -1].i;
                      local_a0.r = local_70.r * fVar28 + -local_70.i * fVar27;
                      local_a0.i = local_70.r * fVar27 + local_70.i * fVar28;
                      fVar28 = local_a8.i;
                      local_a8.r = local_a8.r - local_a0.r;
                      local_a8.i = fVar28 - local_a0.i;
                      iVar23 = iVar23 + *incx;
                      lVar14 = lVar14 + 1;
                      a = local_88;
                      lda = local_80;
                      local_b0 = local_a8;
                    } while (lVar17 != lVar14);
                  }
                  pfVar21 = local_48;
                  pfVar24 = local_50;
                  uVar16 = local_74;
                  n = (integer *)local_60;
                  psVar15 = local_68;
                  pfVar22 = local_48;
                  if ((char)local_74 == 'N') {
                    r_cnjg(&local_a0,a + (int)local_98 * (*lda + 1));
                    psVar15 = &local_a0;
                    goto LAB_0010fe1d;
                  }
                }
                x[(long)iVar18 + -1] = local_a8;
                iVar23 = *incx;
                iVar18 = iVar18 + iVar23;
                pfVar21 = (float *)((long)pfVar22 + 1);
                lVar17 = lVar17 + 1;
                pfVar24 = (float *)((long)pfVar24 + 8);
                if ((long)*n <= (long)pfVar22) {
                  return;
                }
              } while( true );
            }
            local_98 = &a->i;
            lVar17 = 0;
            uVar10 = 1;
            do {
              iVar23 = (int)uVar10 + -1;
              local_a8 = x[uVar10 - 1];
              if ((char)psVar15 == 'T') {
                if (1 < uVar10) {
                  lVar8 = 0;
                  do {
                    fVar28 = *(float *)((long)local_98 + lVar8 + *lda * lVar17 + -4);
                    fVar27 = *(float *)((long)local_98 + lVar8 + *lda * lVar17);
                    uVar1 = *(undefined8 *)((long)&x->r + lVar8);
                    fVar25 = (float)uVar1;
                    fVar26 = (float)((ulong)uVar1 >> 0x20);
                    local_a0.r = fVar28 * fVar25 + fVar26 * -fVar27;
                    local_a0.i = fVar28 * fVar26 + fVar25 * fVar27;
                    fVar28 = local_a8.i;
                    local_a8.r = local_a8.r - local_a0.r;
                    local_a8.i = fVar28 - local_a0.i;
                    lVar8 = lVar8 + 8;
                    local_b0 = local_a8;
                  } while (lVar17 != lVar8);
                }
                if ((char)uVar16 == 'N') {
                  psVar15 = a + iVar23 * (*lda + 1);
LAB_0010f7c0:
                  c_div(&local_b0,&local_a8,psVar15);
                  n = (integer *)local_60;
                  a = local_88;
                  lda = local_80;
                  psVar15 = local_68;
                  local_a8 = local_b0;
                }
              }
              else {
                if (1 < uVar10) {
                  lVar8 = 0;
                  do {
                    r_cnjg(&local_70,(singlecomplex *)((long)&a->r + lVar8 + *lda * lVar17));
                    uVar1 = *(undefined8 *)((long)&x->r + lVar8);
                    fVar28 = (float)uVar1;
                    fVar27 = (float)((ulong)uVar1 >> 0x20);
                    local_a0.r = local_70.r * fVar28 + -local_70.i * fVar27;
                    local_a0.i = local_70.r * fVar27 + local_70.i * fVar28;
                    fVar28 = local_a8.i;
                    local_a8.r = local_a8.r - local_a0.r;
                    local_a8.i = fVar28 - local_a0.i;
                    lVar8 = lVar8 + 8;
                    a = local_88;
                    lda = local_80;
                    local_b0 = local_a8;
                  } while (lVar17 != lVar8);
                }
                uVar16 = local_74;
                n = (integer *)local_60;
                psVar15 = local_68;
                if ((char)local_74 == 'N') {
                  psVar15 = &local_a0;
                  r_cnjg(psVar15,a + iVar23 * (*lda + 1));
                  goto LAB_0010f7c0;
                }
              }
              x[uVar10 - 1] = local_a8;
              lVar17 = lVar17 + 8;
              bVar7 = (long)*n <= (long)uVar10;
              uVar10 = uVar10 + 1;
              if (bVar7) {
                return;
              }
            } while( true );
          }
          local_8c = 8;
        }
      }
      else {
        local_8c = 3;
      }
    }
    else {
      local_8c = 2;
    }
  }
  else {
    local_8c = 1;
  }
  input_error("CTRSV ",&local_8c);
  return;
}

Assistant:

void ctrsv_(char *uplo, char *trans, char *diag, integer *n, 
	singlecomplex *a, integer *lda, singlecomplex *x, integer *incx)
{


    /* System generated locals */

    singlecomplex q__1, q__2, q__3;

    /* Builtin functions */
    void c_div(singlecomplex *, singlecomplex *, singlecomplex *), r_cnjg(singlecomplex *, singlecomplex *);

    /* Local variables */
    integer info;
    singlecomplex temp;
    integer i, j;
    integer ix, jx, kx;
    logical noconj, nounit;

    extern int input_error(char *, int *);

/*  Purpose   
    =======   

    CTRSV  solves one of the systems of equations   

       A*x = b,   or   A'*x = b,   or   conjg( A' )*x = b,   

    where b and x are n element vectors and A is an n by n unit, or   
    non-unit, upper or lower triangular matrix.   

    No test for singularity or near-singularity is included in this   
    routine. Such tests must be performed before calling this routine.   

    Parameters   
    ==========   

    UPLO   - CHARACTER*1.   
             On entry, UPLO specifies whether the matrix is an upper or   
             lower triangular matrix as follows:   

                UPLO = 'U' or 'u'   A is an upper triangular matrix.   

                UPLO = 'L' or 'l'   A is a lower triangular matrix.   

             Unchanged on exit.   

    TRANS  - CHARACTER*1.   
             On entry, TRANS specifies the equations to be solved as   
             follows:   

                TRANS = 'N' or 'n'   A*x = b.   

                TRANS = 'T' or 't'   A'*x = b.   

                TRANS = 'C' or 'c'   conjg( A' )*x = b.   

             Unchanged on exit.   

    DIAG   - CHARACTER*1.   
             On entry, DIAG specifies whether or not A is unit   
             triangular as follows:   

                DIAG = 'U' or 'u'   A is assumed to be unit triangular.   

                DIAG = 'N' or 'n'   A is not assumed to be unit   
                                    triangular.   

             Unchanged on exit.   

    N      - INTEGER.   
             On entry, N specifies the order of the matrix A.   
             N must be at least zero.   
             Unchanged on exit.   

    A      - COMPLEX          array of DIMENSION ( LDA, n ).   
             Before entry with  UPLO = 'U' or 'u', the leading n by n   
             upper triangular part of the array A must contain the upper 
  
             triangular matrix and the strictly lower triangular part of 
  
             A is not referenced.   
             Before entry with UPLO = 'L' or 'l', the leading n by n   
             lower triangular part of the array A must contain the lower 
  
             triangular matrix and the strictly upper triangular part of 
  
             A is not referenced.   
             Note that when  DIAG = 'U' or 'u', the diagonal elements of 
  
             A are not referenced either, but are assumed to be unity.   
             Unchanged on exit.   

    LDA    - INTEGER.   
             On entry, LDA specifies the first dimension of A as declared 
  
             in the calling (sub) program. LDA must be at least   
             max( 1, n ).   
             Unchanged on exit.   

    X      - COMPLEX          array of dimension at least   
             ( 1 + ( n - 1 )*abs( INCX ) ).   
             Before entry, the incremented array X must contain the n   
             element right-hand side vector b. On exit, X is overwritten 
  
             with the solution vector x.   

    INCX   - INTEGER.   
             On entry, INCX specifies the increment for the elements of   
             X. INCX must not be zero.   
             Unchanged on exit.   


    Level 2 Blas routine.   

    -- Written on 22-October-1986.   
       Jack Dongarra, Argonne National Lab.   
       Jeremy Du Croz, Nag Central Office.   
       Sven Hammarling, Nag Central Office.   
       Richard Hanson, Sandia National Labs.   



       Test the input parameters.   

    
   Parameter adjustments   
       Function Body */
#define X(I) x[(I)-1]

#define A(I,J) a[(I)-1 + ((J)-1)* ( *lda)]

    info = 0;
    if ( strncmp(uplo, "U", 1)!=0 && strncmp(uplo, "L", 1)!=0 ) {
	info = 1;
    } else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 &&
		strncmp(trans, "C", 1)!=0 ) {
	info = 2;
    } else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 ) {
	info = 3;
    } else if (*n < 0) {
	info = 4;
    } else if (*lda < max(1,*n)) {
	info = 6;
    } else if (*incx == 0) {
	info = 8;
    }
    if (info != 0) {
	input_error("CTRSV ", &info);
	return;
    }

/*     Quick return if possible. */

    if (*n == 0) {
	return;
    }

    noconj = (strncmp(trans, "T", 1)==0);
    nounit = (strncmp(diag, "N", 1)==0);

/*     Set up the start point in X if the increment is not unity. This   
       will be  ( N - 1 )*INCX  too small for descending loops. */

    if (*incx <= 0) {
	kx = 1 - (*n - 1) * *incx;
    } else if (*incx != 1) {
	kx = 1;
    }

/*     Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */

    if (strncmp(trans, "N", 1)==0) {

/*        Form  x := inv( A )*x. */

	if (strncmp(uplo, "U", 1)==0) {
	    if (*incx == 1) {
		for (j = *n; j >= 1; --j) {
		    if (X(j).r != 0.f || X(j).i != 0.f) {
			if (nounit) {
			    c_div(&q__1, &X(j), &A(j,j));
			    X(j).r = q__1.r, X(j).i = q__1.i;
			}
			temp.r = X(j).r, temp.i = X(j).i;
			for (i = j - 1; i >= 1; --i) {
			    q__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    q__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    q__1.r = X(i).r - q__2.r, q__1.i = X(i).i - 
				    q__2.i;
			    X(i).r = q__1.r, X(i).i = q__1.i;
/* L10: */
			}
		    }
/* L20: */
		}
	    } else {
		jx = kx + (*n - 1) * *incx;
		for (j = *n; j >= 1; --j) {
		    if (X(jx).r != 0.f || X(jx).i != 0.f) {
			if (nounit) {
			    c_div(&q__1, &X(jx), &A(j,j));
			    X(jx).r = q__1.r, X(jx).i = q__1.i;
			}
			temp.r = X(jx).r, temp.i = X(jx).i;
			ix = jx;
			for (i = j - 1; i >= 1; --i) {
			    ix -= *incx;
			    q__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    q__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    q__1.r = X(ix).r - q__2.r, q__1.i = X(ix).i - 
				    q__2.i;
			    X(ix).r = q__1.r, X(ix).i = q__1.i;
/* L30: */
			}
		    }
		    jx -= *incx;
/* L40: */
		}
	    }
	} else {
	    if (*incx == 1) {
		for (j = 1; j <= *n; ++j) {
		    if (X(j).r != 0.f || X(j).i != 0.f) {
			if (nounit) {
			    c_div(&q__1, &X(j), &A(j,j));
			    X(j).r = q__1.r, X(j).i = q__1.i;
			}
			temp.r = X(j).r, temp.i = X(j).i;
			for (i = j + 1; i <= *n; ++i) {
			    q__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    q__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    q__1.r = X(i).r - q__2.r, q__1.i = X(i).i - 
				    q__2.i;
			    X(i).r = q__1.r, X(i).i = q__1.i;
/* L50: */
			}
		    }
/* L60: */
		}
	    } else {
		jx = kx;
		for (j = 1; j <= *n; ++j) {
		    if (X(jx).r != 0.f || X(jx).i != 0.f) {
			if (nounit) {
			    c_div(&q__1, &X(jx), &A(j,j));
			    X(jx).r = q__1.r, X(jx).i = q__1.i;
			}
			temp.r = X(jx).r, temp.i = X(jx).i;
			ix = jx;
			for (i = j + 1; i <= *n; ++i) {
			    ix += *incx;
			    q__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    q__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    q__1.r = X(ix).r - q__2.r, q__1.i = X(ix).i - 
				    q__2.i;
			    X(ix).r = q__1.r, X(ix).i = q__1.i;
/* L70: */
			}
		    }
		    jx += *incx;
/* L80: */
		}
	    }
	}
    } else {

/*        Form  x := inv( A' )*x  or  x := inv( conjg( A' ) )*x. */

	if (strncmp(uplo, "U", 1)==0) {
	    if (*incx == 1) {
		for (j = 1; j <= *n; ++j) {
		    temp.r = X(j).r, temp.i = X(j).i;
		    if (noconj) {
			for (i = 1; i <= j-1; ++i) {
			    q__2.r = A(i,j).r * X(i).r - A(i,j).i * X(
				    i).i, q__2.i = A(i,j).r * X(i).i + 
				    A(i,j).i * X(i).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
/* L90: */
			}
			if (nounit) {
			    c_div(&q__1, &temp, &A(j,j));
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    } else {
			for (i = 1; i <= j-1; ++i) {
			    r_cnjg(&q__3, &A(i,j));
			    q__2.r = q__3.r * X(i).r - q__3.i * X(i).i, 
				    q__2.i = q__3.r * X(i).i + q__3.i * X(
				    i).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
/* L100: */
			}
			if (nounit) {
			    r_cnjg(&q__2, &A(j,j));
			    c_div(&q__1, &temp, &q__2);
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    }
		    X(j).r = temp.r, X(j).i = temp.i;
/* L110: */
		}
	    } else {
		jx = kx;
		for (j = 1; j <= *n; ++j) {
		    ix = kx;
		    temp.r = X(jx).r, temp.i = X(jx).i;
		    if (noconj) {
			for (i = 1; i <= j-1; ++i) {
			    q__2.r = A(i,j).r * X(ix).r - A(i,j).i * X(
				    ix).i, q__2.i = A(i,j).r * X(ix).i + 
				    A(i,j).i * X(ix).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
			    ix += *incx;
/* L120: */
			}
			if (nounit) {
			    c_div(&q__1, &temp, &A(j,j));
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    } else {
			for (i = 1; i <= j-1; ++i) {
			    r_cnjg(&q__3, &A(i,j));
			    q__2.r = q__3.r * X(ix).r - q__3.i * X(ix).i, 
				    q__2.i = q__3.r * X(ix).i + q__3.i * X(
				    ix).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
			    ix += *incx;
/* L130: */
			}
			if (nounit) {
			    r_cnjg(&q__2, &A(j,j));
			    c_div(&q__1, &temp, &q__2);
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    }
		    X(jx).r = temp.r, X(jx).i = temp.i;
		    jx += *incx;
/* L140: */
		}
	    }
	} else {
	    if (*incx == 1) {
		for (j = *n; j >= 1; --j) {
		    temp.r = X(j).r, temp.i = X(j).i;
		    if (noconj) {
			for (i = *n; i >= j+1; --i) {
			    q__2.r = A(i,j).r * X(i).r - A(i,j).i * X(
				    i).i, q__2.i = A(i,j).r * X(i).i + 
				    A(i,j).i * X(i).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
/* L150: */
			}
			if (nounit) {
			    c_div(&q__1, &temp, &A(j,j));
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    } else {
			for (i = *n; i >= j+1; --i) {
			    r_cnjg(&q__3, &A(i,j));
			    q__2.r = q__3.r * X(i).r - q__3.i * X(i).i, 
				    q__2.i = q__3.r * X(i).i + q__3.i * X(
				    i).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
/* L160: */
			}
			if (nounit) {
			    r_cnjg(&q__2, &A(j,j));
			    c_div(&q__1, &temp, &q__2);
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    }
		    X(j).r = temp.r, X(j).i = temp.i;
/* L170: */
		}
	    } else {
		kx += (*n - 1) * *incx;
		jx = kx;
		for (j = *n; j >= 1; --j) {
		    ix = kx;
		    temp.r = X(jx).r, temp.i = X(jx).i;
		    if (noconj) {
			for (i = *n; i >= j+1; --i) {
			    q__2.r = A(i,j).r * X(ix).r - A(i,j).i * X(
				    ix).i, q__2.i = A(i,j).r * X(ix).i + 
				    A(i,j).i * X(ix).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
			    ix -= *incx;
/* L180: */
			}
			if (nounit) {
			    c_div(&q__1, &temp, &A(j,j));
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    } else {
			for (i = *n; i >= j+1; --i) {
			    r_cnjg(&q__3, &A(i,j));
			    q__2.r = q__3.r * X(ix).r - q__3.i * X(ix).i, 
				    q__2.i = q__3.r * X(ix).i + q__3.i * X(
				    ix).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
			    ix -= *incx;
/* L190: */
			}
			if (nounit) {
			    r_cnjg(&q__2, &A(j,j));
			    c_div(&q__1, &temp, &q__2);
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    }
		    X(jx).r = temp.r, X(jx).i = temp.i;
		    jx -= *incx;
/* L200: */
		}
	    }
	}
    }

    return;

/*     End of CTRSV . */

}